

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2646:23)>
::getImpl(SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2646:23)>
          *this,ExceptionOrValue *output)

{
  ResultHolder *pRVar1;
  Maybe<kj::OwnFd> local_3c8;
  Fault local_3c0;
  size_t local_3b8;
  size_t local_3b0;
  DebugComparison<unsigned_long_&,_int> _kjCondition;
  undefined1 local_380 [424];
  ExceptionOr<kj::AsyncCapabilityStream::ReadResult> depResult;
  
  depResult.super_ExceptionOrValue.exception.ptr.isSet = false;
  depResult.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&depResult.super_ExceptionOrValue);
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    local_380[0] = true;
    local_380._8_8_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr;
    local_380._16_8_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_;
    local_380._24_8_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_380._32_8_ = depResult.super_ExceptionOrValue.exception.ptr.field_1.value.file;
    local_380._40_8_ = depResult.super_ExceptionOrValue.exception.ptr.field_1._32_8_;
    local_380._48_8_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr;
    local_380._56_8_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_;
    local_380._64_8_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         (char *)0x0;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ = 0;
    local_380._72_8_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer;
    local_380._80_8_ = depResult.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_380._88_8_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_380._96_8_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_380._104_8_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         (char *)0x0;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy(local_380 + 0x70,
           (void *)((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),0x105);
    local_380._376_8_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr;
    local_380._384_8_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos;
    local_380._392_8_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr;
    local_380._400_8_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0
    ;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         (Detail *)0x0;
    local_380[0x198] = false;
    ExceptionOr<kj::Maybe<kj::OwnFd>_>::operator=
              ((ExceptionOr<kj::Maybe<kj::OwnFd>_> *)output,
               (ExceptionOr<kj::Maybe<kj::OwnFd>_> *)local_380);
    if ((local_380[0x198] == true) && ((bool)local_380[0x19c] == true)) {
      OwnFd::~OwnFd((OwnFd *)(local_380 + 0x1a0));
    }
    if (local_380[0] == true) {
      Exception::~Exception((Exception *)(local_380 + 8));
    }
  }
  else if (depResult.value.ptr.isSet == true) {
    local_3b8 = depResult.value.ptr.field_1.value.byteCount;
    local_3b0 = depResult.value.ptr.field_1.value.capCount;
    if (depResult.value.ptr.field_1.value.byteCount == 0) {
      local_3c8.ptr.isSet = false;
    }
    else {
      _kjCondition.left = &local_3b0;
      _kjCondition.right = 1;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = depResult.value.ptr.field_1.value.capCount == 1;
      if (_kjCondition.result) {
        pRVar1 = (this->func).result.ptr;
        local_3c8.ptr.isSet = true;
        local_3c8.ptr.field_1 =
             (anon_union_4_1_a8c68091_for_NullableValue<kj::OwnFd>_2)(pRVar1->fd).fd;
        (pRVar1->fd).fd = -1;
      }
      else {
        Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[72]>
                  (&local_3c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                   ,0xa5d,FAILED,"actual.capCount == 1",
                   "_kjCondition,\"expected to receive a file descriptor (e.g. via SCM_RIGHTS), but didn\'t\""
                   ,&_kjCondition,
                   (char (*) [72])
                   "expected to receive a file descriptor (e.g. via SCM_RIGHTS), but didn\'t");
        local_3c8.ptr.isSet = false;
        Debug::Fault::~Fault(&local_3c0);
      }
    }
    ExceptionOr<kj::Maybe<kj::OwnFd>_>::ExceptionOr
              ((ExceptionOr<kj::Maybe<kj::OwnFd>_> *)local_380,&local_3c8);
    ExceptionOr<kj::Maybe<kj::OwnFd>_>::operator=
              ((ExceptionOr<kj::Maybe<kj::OwnFd>_> *)output,
               (ExceptionOr<kj::Maybe<kj::OwnFd>_> *)local_380);
    if ((local_380[0x198] == true) && ((bool)local_380[0x19c] == true)) {
      OwnFd::~OwnFd((OwnFd *)(local_380 + 0x1a0));
    }
    if (local_380[0] == true) {
      Exception::~Exception((Exception *)(local_380 + 8));
    }
    if (local_3c8.ptr.isSet == true) {
      OwnFd::~OwnFd(&local_3c8.ptr.field_1.value);
    }
  }
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&depResult.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }